

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

void ipc_pipe_send_cb(void *arg)

{
  nni_mtx *mtx;
  nng_err result;
  nni_aio *pnVar1;
  size_t sVar2;
  nni_msg *m;
  
  pnVar1 = (nni_aio *)((long)arg + 0xa8);
  mtx = (nni_mtx *)((long)arg + 0x608);
  nni_mtx_lock(mtx);
  result = nni_aio_result(pnVar1);
  if (result == NNG_OK) {
    sVar2 = nni_aio_count(pnVar1);
    nni_aio_iov_advance(pnVar1,sVar2);
    sVar2 = nni_aio_iov_count(pnVar1);
    if (sVar2 == 0) {
      pnVar1 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
      nni_aio_list_remove(pnVar1);
      ipc_pipe_send_start((ipc_pipe *)arg);
      m = nni_aio_get_msg(pnVar1);
      sVar2 = nni_msg_len(m);
      nni_pipe_bump_tx(*(nni_pipe **)((long)arg + 0x28),sVar2);
      nni_mtx_unlock(mtx);
      nni_aio_set_msg(pnVar1,(nni_msg *)0x0);
      nni_msg_free(m);
      nni_aio_finish_sync(pnVar1,NNG_OK,sVar2);
      return;
    }
    nng_stream_send(*arg,pnVar1);
  }
  else {
    nni_pipe_bump_error(*(nni_pipe **)((long)arg + 0x28),result);
    while( true ) {
      pnVar1 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
      if (pnVar1 == (nni_aio *)0x0) break;
      nni_aio_list_remove(pnVar1);
      nni_aio_finish_error(pnVar1,result);
    }
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ipc_pipe_send_cb(void *arg)
{
	ipc_pipe *p = arg;
	int       rv;
	nni_aio  *aio;
	size_t    n;
	nni_msg  *msg;
	nni_aio  *tx_aio = &p->tx_aio;

	nni_mtx_lock(&p->mtx);
	if ((rv = nni_aio_result(tx_aio)) != 0) {
		nni_pipe_bump_error(p->pipe, rv);
		// Intentionally we do not queue up another transfer.
		// There's an excellent chance that the pipe is no longer
		// usable, with a partial transfer.
		// The protocol should see this error, and close the
		// pipe itself, we hope.

		while ((aio = nni_list_first(&p->send_q)) != NULL) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
		}
		nni_mtx_unlock(&p->mtx);
		return;
	}

	n = nni_aio_count(tx_aio);
	nni_aio_iov_advance(tx_aio, n);
	if (nni_aio_iov_count(tx_aio) != 0) {
		nng_stream_send(p->conn, tx_aio);
		nni_mtx_unlock(&p->mtx);
		return;
	}

	aio = nni_list_first(&p->send_q);
	nni_aio_list_remove(aio);
	ipc_pipe_send_start(p);

	msg = nni_aio_get_msg(aio);
	n   = nni_msg_len(msg);
	nni_pipe_bump_tx(p->pipe, n);
	nni_mtx_unlock(&p->mtx);

	nni_aio_set_msg(aio, NULL);
	nni_msg_free(msg);
	nni_aio_finish_sync(aio, 0, n);
}